

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O2

void asm_fusearef(ASMState *as,IRIns *ir,RegSet allow)

{
  char cVar1;
  ushort uVar2;
  IRIns *pIVar3;
  uint8_t uVar4;
  int iVar5;
  IRRef2 IVar6;
  Reg RVar7;
  long lVar8;
  IRRef ref;
  ulong uVar9;
  
  uVar9 = (ulong)(ir->field_0).op1;
  ref = (IRRef)(ir->field_0).op1;
  pIVar3 = as->ir;
  (as->mrm).ofs = 0;
  cVar1 = *(char *)((long)pIVar3 + uVar9 * 8 + 5);
  if (cVar1 == ')') {
    lVar8 = (long)*(short *)((long)pIVar3 + uVar9 * 8 + 2);
    if (lVar8 < 0) goto LAB_0013b19d;
    if (*(char *)((long)pIVar3 + lVar8 * 8 + 5) == '\x17') {
      IVar6 = pIVar3[lVar8].field_1.op12;
    }
    else {
      IVar6 = pIVar3[lVar8 + 1].field_1.op12;
    }
  }
  else {
    if (cVar1 != 'E') goto LAB_0013b19d;
    uVar2 = pIVar3[uVar9].field_0.op1;
    if (((*(char *)((long)pIVar3 + (ulong)uVar2 * 8 + 5) != 'Q') ||
        (0x10 < pIVar3[uVar2].field_0.op1)) || (as->fuseref == 0xffffffff)) goto LAB_0013b19d;
    iVar5 = noconflict(as,(uint)uVar2,IR_NEWREF,0);
    if (iVar5 == 0) goto LAB_0013b19d;
    IVar6 = 0x40;
  }
  (as->mrm).ofs = IVar6;
  ref = (IRRef)pIVar3[uVar9].field_0.op1;
LAB_0013b19d:
  RVar7 = ra_alloc1(as,ref,allow);
  (as->mrm).base = (uint8_t)RVar7;
  if ((long)(short)(ir->field_0).op2 < 0) {
    (as->mrm).scale = 0xc0;
    RVar7 = ra_alloc1(as,(uint)(ir->field_0).op2,allow & ~(1 << (RVar7 & 0x1f)));
    uVar4 = (uint8_t)RVar7;
  }
  else {
    (as->mrm).ofs = (as->mrm).ofs + as->ir[(short)(ir->field_0).op2].field_1.op12 * 8;
    uVar4 = 0x80;
  }
  (as->mrm).idx = uVar4;
  return;
}

Assistant:

static void asm_fusearef(ASMState *as, IRIns *ir, RegSet allow)
{
  IRIns *irx;
  lj_assertA(ir->o == IR_AREF, "expected AREF");
  as->mrm.base = (uint8_t)ra_alloc1(as, asm_fuseabase(as, ir->op1), allow);
  irx = IR(ir->op2);
  if (irref_isk(ir->op2)) {
    as->mrm.ofs += 8*irx->i;
    as->mrm.idx = RID_NONE;
  } else {
    rset_clear(allow, as->mrm.base);
    as->mrm.scale = XM_SCALE8;
    /* Fuse a constant ADD (e.g. t[i+1]) into the offset.
    ** Doesn't help much without ABCelim, but reduces register pressure.
    */
    if (!LJ_64 &&  /* Has bad effects with negative index on x64. */
	mayfuse(as, ir->op2) && ra_noreg(irx->r) &&
	irx->o == IR_ADD && irref_isk(irx->op2)) {
      as->mrm.ofs += 8*IR(irx->op2)->i;
      as->mrm.idx = (uint8_t)ra_alloc1(as, irx->op1, allow);
    } else {
      as->mrm.idx = (uint8_t)ra_alloc1(as, ir->op2, allow);
    }
  }
}